

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O0

string * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalWatcomWMakeGenerator>::GetDefaultPlatformName_abi_cxx11_
          (string *__return_storage_ptr__,
          cmGlobalGeneratorSimpleFactory<cmGlobalWatcomWMakeGenerator> *this)

{
  cmGlobalGeneratorSimpleFactory<cmGlobalWatcomWMakeGenerator> *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetDefaultPlatformName() const override { return std::string(); }